

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::run
          (UniformLocationCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  TextureFormat TVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  ShaderStage SVar6;
  Type TVar7;
  TestLog *pTVar8;
  RenderContext *context;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  void *pvVar11;
  undefined1 auVar12 [4];
  bool bVar13;
  DataType DVar14;
  int iVar15;
  int iVar16;
  deUint32 dVar17;
  Precision PVar18;
  IterateResult extraout_EAX;
  long *plVar19;
  ostream *poVar20;
  char *pcVar21;
  TextureFormat *pTVar22;
  undefined8 *puVar23;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pUVar24;
  long lVar25;
  Texture2D *this_00;
  TestError *this_01;
  int iVar26;
  ulong *puVar27;
  VarTypeComponent VVar28;
  _anonymous_namespace_ *p_Var29;
  size_type sVar30;
  int precision;
  VarTypeComponent VVar31;
  VarType *type;
  VarType *type_00;
  _anonymous_namespace_ *p_Var32;
  SubTypeIterator<glu::IsBasicType> *pSVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  qpTestResult testResult;
  string *__v;
  undefined8 uVar37;
  TypeComponentVector *pTVar38;
  _Alloc_hider _Var39;
  VarTypeComponent VVar40;
  VarTypeComponent VVar41;
  VarTypeComponent VVar42;
  TypeComponentVector *pTVar43;
  uint uVar44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar45;
  UniformLocationCase *pUVar46;
  uint uVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  StructType *structType;
  string uniName;
  Surface rendered;
  string layout;
  RandomViewport viewport;
  VarType subType;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  declaredStructs;
  deInt32 intBuf [4];
  BasicTypeIterator subTypeIter;
  deUint16 indices [6];
  ostringstream vertMain;
  ostringstream fragMain;
  ostringstream fragDecl;
  ShaderProgram program;
  ProgramSources sources;
  undefined1 local_a78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a68;
  string local_a58;
  UniformLocationCase *local_a38;
  undefined1 local_a30 [32];
  long local_a10;
  string local_a08;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *local_9e8;
  pointer local_9e0;
  uint local_9d8;
  uint uStack_9d4;
  int iStack_9d0;
  int iStack_9cc;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [24];
  ulong local_990;
  _anonymous_namespace_ *local_988;
  int local_97c;
  undefined1 local_978 [16];
  VarType local_968;
  size_t local_950;
  SubTypeIterator<glu::IsBasicType> local_948;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined1 local_908 [4];
  float fStack_904;
  undefined1 auStack_900 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0 [4];
  ios_base local_898 [8];
  ios_base local_890 [264];
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  VarTypeComponent local_750;
  VarTypeComponent local_748;
  VarTypeComponent local_740;
  VarTypeComponent local_738;
  VarTypeComponent local_730;
  VarTypeComponent local_728;
  VarTypeComponent local_720;
  VarTypeComponent local_718;
  undefined8 *local_710;
  VarTypeComponent local_708;
  Texture2D *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined1 local_6e8 [8];
  undefined1 auStack_6e0 [8];
  VarTypeComponent local_6d8;
  _Base_ptr p_Stack_6d0;
  _Base_ptr local_6c8;
  size_t sStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  ios_base local_678 [264];
  undefined1 local_570 [8];
  VarType local_568 [4];
  ios_base local_500 [264];
  undefined1 local_3f8 [8];
  pointer pVStack_3f0;
  Data local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ios_base local_388 [272];
  undefined1 local_278 [112];
  ios_base local_208 [40];
  deUint32 local_1e0;
  bool local_1b8;
  ProgramSources local_100;
  undefined4 extraout_var_03;
  
  local_9e8 = uniformList;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n",0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"out highp vec4 v_color;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"#version 310 es\n\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,
             "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n",0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"in highp vec4 v_color;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"layout(location = 0) out mediump vec4 o_color;\n\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e8,"void main()\n{\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6e8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6e8,"\tv_color = vec4(1.0);\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_570,"void main()\n{\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_570,"\to_color = v_color;\n",0x14);
  local_968.m_data.array.elementType = (VarType *)(local_978 + 8);
  local_978._8_4_ = _S_red;
  local_968.m_type = STRUCT_MEMBER;
  local_968._4_4_ = 0;
  local_950 = 0;
  pUVar24 = (local_9e8->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a38 = this;
  local_968.m_data._8_8_ = local_968.m_data.basic;
  if (0 < (int)((ulong)((long)(local_9e8->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar24) >> 3) *
          -0x33333333) {
    lVar35 = 0;
    do {
      paVar45 = &local_a58.field_2;
      pUVar24 = pUVar24 + lVar35;
      SVar6 = pUVar24->declareLocation;
      uVar3 = pUVar24->layoutLocation;
      uVar4 = pUVar24->checkLocation;
      iStack_9d0 = 0;
      iStack_9cc = 0;
      local_a10 = lVar35;
      local_9d8 = uVar3;
      uStack_9d4 = uVar4;
      if (pUVar24->location < 0) {
        local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
        local_a08._M_string_length = 0;
        local_a08.field_2._M_allocated_capacity =
             local_a08.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
        std::ostream::operator<<((ostringstream *)local_908,pUVar24->location);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
        std::ios_base::~ios_base(local_898);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_a78,0,(char *)0x0,0x1b3501f);
        puVar27 = (ulong *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar27) {
          local_a58.field_2._M_allocated_capacity = *puVar27;
          local_a58.field_2._8_8_ = plVar19[3];
          local_a58._M_dataplus._M_p = (pointer)paVar45;
        }
        else {
          local_a58.field_2._M_allocated_capacity = *puVar27;
          local_a58._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_a58._M_string_length = plVar19[1];
        *plVar19 = (long)puVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_a58);
        local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
        puVar27 = (ulong *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar27) {
          local_a08.field_2._M_allocated_capacity = *puVar27;
          local_a08.field_2._8_8_ = plVar19[3];
        }
        else {
          local_a08.field_2._M_allocated_capacity = *puVar27;
          local_a08._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_a08._M_string_length = plVar19[1];
        *plVar19 = (long)puVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a58._M_dataplus._M_p != paVar45) {
          operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._0_8_ != &local_a68) {
          operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
      std::ostream::operator<<((ostringstream *)local_908,(int)local_a10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
      std::ios_base::~ios_base(local_898);
      VVar40 = (VarTypeComponent)0x3;
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_a78,0,(char *)0x0,0x1a79b6a);
      puVar27 = (ulong *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar27) {
        local_a58.field_2._M_allocated_capacity = *puVar27;
        local_a58.field_2._8_8_ = plVar19[3];
        local_a58._M_dataplus._M_p = (pointer)paVar45;
      }
      else {
        local_a58.field_2._M_allocated_capacity = *puVar27;
        local_a58._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_a58._M_string_length = plVar19[1];
      *plVar19 = (long)puVar27;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._0_8_ != &local_a68) {
        operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
      }
      iVar15 = pUVar24->location;
      if ((pUVar24->type).m_type == TYPE_STRUCT) {
        local_a78._0_4_ = *(DataType *)&(pUVar24->type).m_data;
        local_a78._4_4_ = *(Precision *)((long)&(pUVar24->type).m_data + 4);
        if ((VarTypeComponent)local_968._0_8_ != (VarTypeComponent)0x0) {
          VVar42 = (VarTypeComponent)local_968._0_8_;
          VVar40 = (VarTypeComponent)((long)local_978 + 8);
          do {
            VVar41 = VVar40;
            VVar31 = VVar42;
            VVar28 = *(VarTypeComponent *)((long)VVar31 + 0x20);
            VVar40 = VVar31;
            if ((ulong)VVar28 < (ulong)local_a78._0_8_) {
              VVar40 = VVar41;
            }
            VVar42 = ((VarTypeComponent *)((long)VVar31 + 0x10))
                     [(ulong)VVar28 < (ulong)local_a78._0_8_];
          } while (((VarTypeComponent *)((long)VVar31 + 0x10))
                   [(ulong)VVar28 < (ulong)local_a78._0_8_] != (VarTypeComponent)0x0);
          if (VVar40 != (VarTypeComponent)((long)local_978 + 8)) {
            if ((ulong)VVar28 < (ulong)local_a78._0_8_) {
              VVar31 = VVar41;
            }
            if ((ulong)*(VarTypeComponent *)((long)VVar31 + 0x20) <= (ulong)local_a78._0_8_)
            goto LAB_015242c8;
          }
        }
        if ((SVar6 & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE) {
          auStack_900._0_4_ = TYPE_INVALID;
          local_908 = (undefined1  [4])local_a78._0_4_;
          fStack_904 = (float)local_a78._4_4_;
          poVar20 = glu::decl::operator<<((ostream *)local_278,(DeclareStructTypePtr *)local_908);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
        }
        if ((SVar6 & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE) {
          local_908 = SUB84(local_a78._0_8_,0);
          fStack_904 = SUB84(local_a78._0_8_,4);
          auStack_900._0_4_ = TYPE_INVALID;
          poVar20 = glu::decl::operator<<((ostream *)local_3f8,(DeclareStructTypePtr *)local_908);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
        }
        std::
        _Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
        ::_M_insert_unique<glu::StructType_const*const&>
                  ((_Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
                    *)local_978,(StructType **)local_a78);
      }
LAB_015242c8:
      uVar44 = local_9d8 & 1;
      uVar47 = uStack_9d4 & 1;
      local_9d8 = -(uint)((local_9d8 & 2) == 0);
      uStack_9d4 = -(uint)((uStack_9d4 & 2) == 0);
      iStack_9d0 = -(uint)(uVar44 == 0);
      iStack_9cc = -(uint)(uVar47 == 0);
      if ((SVar6 & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"uniform ",8);
        auVar9._4_4_ = uStack_9d4;
        auVar9._0_4_ = local_9d8;
        auVar9._8_4_ = iStack_9d0;
        local_a78._0_8_ = &local_a68;
        if ((auVar9 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a78,local_a08._M_dataplus._M_p,
                     local_a08._M_string_length + local_a08._M_dataplus._M_p);
        }
        else {
          local_a78._8_4_ = TYPE_INVALID;
          local_a78._12_4_ = PRECISION_LOWP;
          local_a68._M_allocated_capacity = local_a68._M_allocated_capacity & 0xffffffffffffff00;
        }
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(char *)local_a78._0_8_,local_a78._8_8_);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_908,&pUVar24->type,&local_a58,0);
        poVar20 = glu::decl::operator<<(poVar20,(DeclareVariable *)local_908);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_900._16_8_ != local_8e0) {
          operator_delete((void *)auStack_900._16_8_,local_8e0[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_908);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._0_8_ != &local_a68) {
          operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
        }
      }
      if ((SVar6 & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"uniform ",8);
        local_a78._0_8_ = &local_a68;
        auVar10._4_4_ = uStack_9d4;
        auVar10._0_4_ = local_9d8;
        auVar10._8_4_ = iStack_9d0;
        if ((auVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a78,local_a08._M_dataplus._M_p,
                     local_a08._M_string_length + local_a08._M_dataplus._M_p);
        }
        else {
          local_a78._8_4_ = TYPE_INVALID;
          local_a78._12_4_ = PRECISION_LOWP;
          local_a68._M_allocated_capacity = local_a68._M_allocated_capacity & 0xffffffffffffff00;
        }
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)local_a78._0_8_,local_a78._8_8_);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_908,&pUVar24->type,&local_a58,0);
        poVar20 = glu::decl::operator<<(poVar20,(DeclareVariable *)local_908);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_900._16_8_ != local_8e0) {
          operator_delete((void *)auStack_900._16_8_,local_8e0[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_908);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._0_8_ != &local_a68) {
          operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
        }
      }
      glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)local_908,&pUVar24->type);
      auVar51._4_4_ = uStack_9d4;
      auVar51._0_4_ = local_9d8;
      auVar51._8_4_ = iStack_9d0;
      auVar51._12_4_ = iStack_9cc;
      uVar44 = movmskps((Type)&local_a68,auVar51);
      iVar34 = iVar15;
      while( true ) {
        local_a68._M_allocated_capacity = 0;
        local_a68._8_8_ = (pointer)0x0;
        local_a78._0_4_ = STRUCT_MEMBER;
        local_a78._4_4_ = 0;
        local_a78._8_4_ = TYPE_INVALID;
        local_a78._12_4_ = PRECISION_LOWP;
        bVar13 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                           ((SubTypeIterator<glu::IsBasicType> *)local_908,
                            (SubTypeIterator<glu::IsBasicType> *)local_a78);
        if ((anon_struct_8_2_bfd9d0cb_for_basic)local_a78._8_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          operator_delete((void *)local_a78._8_8_,local_a68._8_8_ - local_a78._8_8_);
        }
        if (!bVar13) break;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)local_9b8,(glu *)pUVar24,
                   (VarType *)CONCAT44(auStack_900._4_4_,auStack_900._0_4_),
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )auStack_900._8_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )VVar40);
        DVar14 = glu::getDataTypeScalarType(local_9b8._8_4_);
        pcVar21 = glu::getDataTypeName(DVar14);
        iVar16 = -1;
        if (-1 < iVar15) {
          iVar16 = iVar34;
        }
        fVar48 = getExpectedValue(DVar14,iVar16,pcVar21);
        de::floatToString_abi_cxx11_((string *)local_a78,(de *)0x3,fVar48,precision);
        if (DVar14 - TYPE_SAMPLER_1D < 0x1e) {
          if ((byte)((byte)uVar44 >> 3) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6e8,"\tv_color.rgb *= verify(float( texture(",0x26);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6e8,local_a58._M_dataplus._M_p,
                                 local_a58._M_string_length);
            local_a30._8_8_ = auStack_900;
            local_a30._0_8_ = pUVar24;
            poVar20 = glu::operator<<(poVar20,(TypeAccessFormat *)local_a30);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", vec2(0.5)).r), ",0x11);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a78._0_8_,local_a78._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,");\n",3);
          }
          if ((uVar44 & 2) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_570,"\to_color.rgb *= verify(float( texture(",0x26);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_570,local_a58._M_dataplus._M_p,
                                 local_a58._M_string_length);
            local_a30._8_8_ = auStack_900;
            local_a30._0_8_ = pUVar24;
            poVar20 = glu::operator<<(poVar20,(TypeAccessFormat *)local_a30);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", vec2(0.5)).r), ",0x11);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a78._0_8_,local_a78._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,");\n",3);
          }
        }
        else {
          if ((byte)((byte)uVar44 >> 3) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6e8,"\tv_color.rgb *= verify(float(",0x1d);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6e8,local_a58._M_dataplus._M_p,
                                 local_a58._M_string_length);
            local_9c0 = (TypeComponentVector *)auStack_900;
            local_9c8 = pUVar24;
            poVar20 = glu::operator<<(poVar20,(TypeAccessFormat *)&local_9c8);
            Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                      ((string *)local_a30,(_anonymous_namespace_ *)local_9b8,type);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a30._0_8_,local_a30._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"), ",3);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a78._0_8_,local_a78._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,");\n",3);
            if ((pointer)local_a30._0_8_ != (pointer)(local_a30 + 0x10)) {
              operator_delete((void *)local_a30._0_8_,(ulong)(local_a30._16_8_ + 1));
            }
          }
          if ((uVar44 & 2) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_570,"\to_color.rgb *= verify(float(",0x1d);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_570,local_a58._M_dataplus._M_p,
                                 local_a58._M_string_length);
            local_9c0 = (TypeComponentVector *)auStack_900;
            local_9c8 = pUVar24;
            poVar20 = glu::operator<<(poVar20,(TypeAccessFormat *)&local_9c8);
            Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                      ((string *)local_a30,(_anonymous_namespace_ *)local_9b8,type_00);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a30._0_8_,local_a30._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"), ",3);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_a78._0_8_,local_a78._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,");\n",3);
            if ((pointer)local_a30._0_8_ != (pointer)(local_a30 + 0x10)) {
              operator_delete((void *)local_a30._0_8_,(ulong)(local_a30._16_8_ + 1));
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._0_8_ != &local_a68) {
          operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
        }
        glu::VarType::~VarType((VarType *)local_9b8);
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  (&local_948,(SubTypeIterator<glu::IsBasicType> *)local_908,0);
        if (local_948.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_948.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_948.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_948.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar34 = iVar34 + 1;
      }
      pvVar11 = (void *)CONCAT44(auStack_900._4_4_,auStack_900._0_4_);
      if (pvVar11 != (void *)0x0) {
        operator_delete(pvVar11,auStack_900._16_8_ - (long)pvVar11);
      }
      lVar35 = local_a10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
        operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
        operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
      }
      lVar35 = lVar35 + 1;
      pUVar24 = (local_9e8->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar35 < (int)((ulong)((long)(local_9e8->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pUVar24) >> 3) * -0x33333333);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_570,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  uVar37 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    uVar37 = local_a08.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar37 < local_a08._M_string_length + local_a58._M_string_length) {
    uVar37 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
      uVar37 = local_a58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar37 < local_a08._M_string_length + local_a58._M_string_length) goto LAB_01524a40;
    pTVar22 = (TextureFormat *)
              std::__cxx11::string::replace
                        ((ulong)&local_a58,0,(char *)0x0,(ulong)local_a08._M_dataplus._M_p);
  }
  else {
LAB_01524a40:
    pTVar22 = (TextureFormat *)
              std::__cxx11::string::_M_append((char *)&local_a08,(ulong)local_a58._M_dataplus._M_p);
  }
  _local_908 = (TextureFormat)((long)auStack_900 + 8);
  TVar1 = (TextureFormat)(pTVar22 + 2);
  if (*pTVar22 == TVar1) {
    auStack_900._8_8_ = *(undefined8 *)TVar1;
    auStack_900._16_8_ = pTVar22[3];
  }
  else {
    auStack_900._8_8_ = *(undefined8 *)TVar1;
    _local_908 = *pTVar22;
  }
  auStack_900._0_4_ = pTVar22[1].order;
  auStack_900._4_4_ = pTVar22[1].type;
  *pTVar22 = TVar1;
  pTVar22[1].order = R;
  pTVar22[1].type = SNORM_INT8;
  *(undefined1 *)TVar1 = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  pTVar43 = (TypeComponentVector *)((long)(Type *)local_9b8._8_8_ + local_a30._8_8_);
  pTVar38 = (TypeComponentVector *)0xf;
  if ((pointer)local_a30._0_8_ != (pointer)(local_a30 + 0x10)) {
    pTVar38 = (TypeComponentVector *)local_a30._16_8_;
  }
  if (pTVar38 < pTVar43) {
    pTVar38 = (TypeComponentVector *)0xf;
    if ((undefined1 *)local_9b8._0_8_ != local_9b8 + 0x10) {
      pTVar38 = (TypeComponentVector *)local_9a8._0_8_;
    }
    if (pTVar43 <= pTVar38) {
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_9b8,0,(char *)0x0,local_a30._0_8_);
      goto LAB_01524b45;
    }
  }
  puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_a30,local_9b8._0_8_);
LAB_01524b45:
  local_a78._0_8_ = &local_a68;
  paVar45 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar23 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar23 == paVar45) {
    local_a68._M_allocated_capacity = paVar45->_M_allocated_capacity;
    local_a68._8_8_ = puVar23[3];
  }
  else {
    local_a68._M_allocated_capacity = paVar45->_M_allocated_capacity;
    local_a78._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar23;
  }
  local_a78._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(puVar23 + 1);
  *puVar23 = paVar45;
  puVar23[1] = 0;
  paVar45->_M_local_buf[0] = '\0';
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,(value_type *)local_908);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,(value_type *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,(ulong)(local_a68._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_9b8._0_8_ != local_9b8 + 0x10) {
    operator_delete((void *)local_9b8._0_8_,(ulong)(local_9a8._0_8_ + 1));
  }
  if ((pointer)local_a30._0_8_ != (pointer)(local_a30 + 0x10)) {
    operator_delete((void *)local_a30._0_8_,(ulong)(local_a30._16_8_ + 1));
  }
  if (_local_908 != (TextureFormat)((long)auStack_900 + 8)) {
    operator_delete((void *)_local_908,auStack_900._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~_Rb_tree((_Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
               *)local_978);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
  std::ios_base::~ios_base(local_500);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base(local_388);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
  std::ios_base::~ios_base(local_678);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  pUVar46 = local_a38;
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_278,local_a38->m_renderCtx,&local_100);
  iVar15 = tcu::CommandLine::getBaseSeed
                     (((pUVar46->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  iVar34 = (*pUVar46->m_renderCtx->_vptr_RenderContext[3])();
  iVar16 = (*pUVar46->m_renderCtx->_vptr_RenderContext[4])();
  dVar17 = deStringHash((local_a38->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  VVar40.index = 0;
  VVar40.type = dVar17 + iVar15;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&local_9c8,(RenderTarget *)CONCAT44(extraout_var_00,iVar16),0x10,0x10
             ,dVar17 + iVar15);
  tcu::Surface::Surface((Surface *)local_a30,0x10,0x10);
  pUVar46 = local_a38;
  iVar15 = (*local_a38->m_renderCtx->_vptr_RenderContext[3])();
  local_a10 = CONCAT44(extraout_var_01,iVar15);
  bVar13 = ((*(Shader **)local_278._0_8_)->m_info).compileOk;
  bVar5 = ((*(Shader **)local_278._24_8_)->m_info).compileOk;
  local_988 = (_anonymous_namespace_ *)CONCAT44(local_988._4_4_,local_1e0);
  local_9e0 = (pointer)((pUVar46->super_TestCase).super_TestNode.m_testCtx)->m_log;
  auStack_6e0 = (undefined1  [8])((ulong)(uint)auStack_6e0._4_4_ << 0x20);
  local_6d8.type = STRUCT_MEMBER;
  local_6d8.index = 0;
  p_Stack_6d0 = (_Base_ptr)auStack_6e0;
  sStack_6c0 = 0;
  local_990 = CONCAT44(extraout_var,iVar34);
  local_6c8 = p_Stack_6d0;
  glu::operator<<((TestLog *)local_9e0,(ShaderProgram *)local_278);
  if (((bVar13 == false) || (bVar5 == false)) || (local_1b8 == false)) {
    local_908 = SUB84(local_9e0,0);
    fStack_904 = (float)((ulong)local_9e0 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_900);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_900,"ERROR: shader failed to compile/link",0x24);
    pUVar46 = local_a38;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_908,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_900);
    std::ios_base::~ios_base(local_890);
    tcu::TestContext::setTestResult
              ((pUVar46->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed to compile/link");
LAB_01525e85:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_6e8);
  }
  else {
    pUVar24 = (local_9e8->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(local_9e8->
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar24) >> 3) *
            -0x33333333) {
      lVar35 = 0;
      do {
        local_9d8 = (uint)lVar35;
        uStack_9d4 = (uint)((ulong)lVar35 >> 0x20);
        pUVar24 = pUVar24 + lVar35;
        glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsBasicType> *)local_3f8,&pUVar24->type);
        iVar15 = 0;
        while( true ) {
          auStack_900._8_8_ = 0;
          auStack_900._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_908 = (undefined1  [4])0x0;
          fStack_904 = 0.0;
          auStack_900._0_4_ = TYPE_INVALID;
          auStack_900._4_4_ = PRECISION_LOWP;
          bVar13 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                             ((SubTypeIterator<glu::IsBasicType> *)local_3f8,
                              (SubTypeIterator<glu::IsBasicType> *)local_908);
          pvVar11 = (void *)CONCAT44(auStack_900._4_4_,auStack_900._0_4_);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11,auStack_900._16_8_ - (long)pvVar11);
          }
          if (!bVar13) break;
          Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                    ((string *)local_570,(_anonymous_namespace_ *)CONCAT44(uStack_9d4,local_9d8),
                     (int)pUVar24,(VarType *)&pVStack_3f0,(TypeComponentVector *)VVar40);
          iVar16 = (**(code **)(local_a10 + 0xb48))((ulong)local_988 & 0xffffffff,local_570);
          fVar48 = fStack_904;
          auVar12 = local_908;
          pUVar46 = local_a38;
          local_a08._M_dataplus._M_p._0_4_ = iVar16;
          iVar26 = pUVar24->location + iVar15;
          if (pUVar24->location < 0) {
            iVar26 = -1;
          }
          local_a58._M_dataplus._M_p._0_4_ = iVar26;
          local_908 = SUB84(local_9e0,0);
          fStack_904 = (float)((ulong)local_9e0 >> 0x20);
          if (iVar26 < 0) {
            if (-1 < iVar16) {
              __v = &local_a08;
              VVar40 = local_6d8;
              if (local_6d8 != (VarTypeComponent)0x0) {
                VVar42 = (VarTypeComponent)auStack_6e0;
                do {
                  VVar31 = VVar42;
                  VVar28 = VVar40;
                  TVar7 = ((pointer)((long)VVar28 + 0x20))->type;
                  VVar42 = VVar28;
                  if ((int)TVar7 < iVar16) {
                    VVar42 = VVar31;
                  }
                  VVar40 = ((pointer)((long)VVar28 + 0x10))[(int)TVar7 < iVar16];
                } while (((pointer)((long)VVar28 + 0x10))[(int)TVar7 < iVar16] !=
                         (VarTypeComponent)0x0);
                __v = &local_a08;
                VVar40 = (VarTypeComponent)auStack_6e0;
                if (VVar42 != VVar40) {
                  if ((int)TVar7 < iVar16) {
                    VVar28 = VVar31;
                  }
                  if ((int)((pointer)((long)VVar28 + 0x20))->type <= iVar16) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_900);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900,"ERROR: found uniform ",0x15);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900,(char *)local_570,local_568[0]._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900," in location ",0xd);
                    std::ostream::operator<<
                              ((ostringstream *)auStack_900,(int)local_a08._M_dataplus._M_p);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900," which has already been used",0x1c);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_908,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_900);
                    std::ios_base::~ios_base(local_890);
LAB_01525284:
                    pcVar21 = "Overlapping uniform location";
                    goto LAB_0152528c;
                  }
                }
              }
LAB_015250eb:
              local_908 = auVar12;
              fStack_904 = fVar48;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_6e8,(int *)__v);
              auVar12 = local_908;
              fVar48 = fStack_904;
            }
            fStack_904 = fVar48;
            local_908 = auVar12;
            iVar34 = 0;
            auVar12 = local_908;
            fVar48 = fStack_904;
          }
          else if ((iVar16 != -1) || (iVar34 = 7, pUVar24->checkLocation != SHADERSTAGE_NONE)) {
            if (iVar16 == iVar26) {
              __v = &local_a58;
              VVar40 = local_6d8;
              if (local_6d8 != (VarTypeComponent)0x0) {
                VVar42 = (VarTypeComponent)auStack_6e0;
                do {
                  VVar31 = VVar42;
                  VVar28 = VVar40;
                  iVar34 = *(int *)((long)VVar28 + 0x20);
                  VVar42 = VVar28;
                  if (iVar34 < iVar16) {
                    VVar42 = VVar31;
                  }
                  VVar40 = *(VarTypeComponent *)
                            ((pointer *)((long)VVar28 + 0x10) + (iVar34 < iVar16));
                } while (*(VarTypeComponent *)((pointer *)((long)VVar28 + 0x10) + (iVar34 < iVar16))
                         != (VarTypeComponent)0x0);
                __v = &local_a58;
                VVar40 = (VarTypeComponent)auStack_6e0;
                if (VVar42 != VVar40) {
                  if (iVar34 < iVar16) {
                    VVar28 = VVar31;
                  }
                  if ((int)((pointer)((long)VVar28 + 0x20))->type <= iVar16) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_900);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900,"ERROR: expected uniform ",0x18);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900,(char *)local_570,local_568[0]._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900," in location ",0xd);
                    std::ostream::operator<<
                              ((ostringstream *)auStack_900,(int)local_a08._M_dataplus._M_p);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_900," but it has already been used",0x1d);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_908,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_900);
                    std::ios_base::~ios_base(local_890);
                    goto LAB_01525284;
                  }
                }
              }
              goto LAB_015250eb;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_900);
            pUVar46 = local_a38;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_900,"ERROR: found uniform ",0x15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_900,(char *)local_570,local_568[0]._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_900," in location ",0xd);
            std::ostream::operator<<((ostringstream *)auStack_900,(int)local_a08._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_900," when it should have been in ",0x1d);
            std::ostream::operator<<((ostringstream *)auStack_900,(int)local_a58._M_dataplus._M_p);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_908,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_900);
            std::ios_base::~ios_base(local_890);
            pcVar21 = "Incorrect uniform location";
LAB_0152528c:
            iVar34 = 1;
            tcu::TestContext::setTestResult
                      ((pUVar46->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       pcVar21);
            auVar12 = local_908;
            fVar48 = fStack_904;
          }
          fStack_904 = fVar48;
          local_908 = auVar12;
          if (local_570 != (undefined1  [8])&local_568[0].m_data) {
            operator_delete((void *)local_570,
                            (ulong)((long)&((VarType *)local_568[0].m_data._0_8_)->m_type + 1));
          }
          if ((iVar34 != 7) && (iVar34 != 0)) goto LAB_01525314;
          glu::SubTypeIterator<glu::IsBasicType>::operator++
                    ((SubTypeIterator<glu::IsBasicType> *)local_978,
                     (SubTypeIterator<glu::IsBasicType> *)local_3f8,0);
          iVar15 = iVar15 + 1;
          pvVar11 = (void *)CONCAT44(local_978._12_4_,local_978._8_4_);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11,(long)local_968.m_data.array.elementType - (long)pvVar11);
          }
        }
        iVar34 = 5;
LAB_01525314:
        if (pVStack_3f0 != (pointer)0x0) {
          operator_delete(pVStack_3f0,local_3e8._8_8_ - (long)pVStack_3f0);
        }
        if ((iVar34 != 0) && (iVar34 != 5)) goto LAB_01525e85;
        lVar35 = CONCAT44(uStack_9d4,local_9d8) + 1;
        pUVar24 = (local_9e8->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar35 < (int)((ulong)((long)(local_9e8->
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pUVar24) >> 3) * -0x33333333);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_6e8);
    uVar36 = local_990;
    (**(code **)(local_990 + 0x1c0))();
    pUVar46 = local_a38;
    (**(code **)(uVar36 + 0x188))(0x4500);
    (**(code **)(uVar36 + 0x1a00))
              ((ulong)local_9c8 & 0xffffffff,local_9c8._4_4_,(ulong)local_9c0 & 0xffffffff,
               local_9c0._4_4_);
    iVar15 = (*pUVar46->m_renderCtx->_vptr_RenderContext[3])();
    lVar35 = CONCAT44(extraout_var_02,iVar15);
    local_990 = CONCAT44(local_990._4_4_,local_1e0);
    iVar15 = (**(code **)(lVar35 + 0x780))();
    local_6b8 = 0x3f8000003f800000;
    uStack_6b0 = 0x3f8000003dcccccd;
    local_6c8 = (_Base_ptr)0xbf8000003f800000;
    sStack_6c0 = 0x3f8000003dcccccd;
    local_6d8.type = 0xbf800000;
    local_6d8.index = 0x3f800000;
    p_Stack_6d0 = (_Base_ptr)0x3f8000003dcccccd;
    local_6e8._0_4_ = 0xbf800000;
    local_6e8._4_4_ = 0xbf800000;
    auStack_6e0 = (undefined1  [8])0x3f8000003dcccccd;
    local_6f8 = 0x2000200010000;
    local_6f0 = 0x30001;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3e8.array.elementType = (VarType *)0x0;
    local_3e8._8_8_ = (pointer)0x0;
    local_3f8 = (undefined1  [8])0x0;
    pVStack_3f0 = (pointer)0x0;
    local_948.m_type = (VarType *)0x0;
    local_948.m_path.
    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_9b8._0_8_ = (VarType *)0x0;
    local_9b8._8_4_ = TYPE_INVALID;
    local_9b8._12_4_ = PRECISION_LOWP;
    local_a58._M_dataplus._M_p = (pointer)0x0;
    local_a58._M_string_length = 0;
    local_a58.field_2._M_allocated_capacity = 0;
    if (iVar15 < 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"posLoc >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                 ,0x224);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar35 + 0x1680))(local_990 & 0xffffffff);
    pUVar24 = (local_9e8->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((local_9e8->
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
        )._M_impl.super__Vector_impl_data._M_finish != pUVar24) {
      local_718 = (VarTypeComponent)(lVar35 + 0x1640);
      local_720 = (VarTypeComponent)(lVar35 + 0x1660);
      local_728 = (VarTypeComponent)(lVar35 + 0x1650);
      local_730 = (VarTypeComponent)(lVar35 + 0x1630);
      local_738 = (VarTypeComponent)(lVar35 + 0x1610);
      local_740 = (VarTypeComponent)(lVar35 + 0x1620);
      local_748 = (VarTypeComponent)(lVar35 + 0x1600);
      local_750 = (VarTypeComponent)(lVar35 + 0x15f0);
      local_708 = (VarTypeComponent)(lVar35 + 0x15e0);
      local_910 = (undefined8 *)(lVar35 + 0x15b8);
      local_918 = (undefined8 *)(lVar35 + 0x1578);
      local_710 = (undefined8 *)(lVar35 + 0x14e8);
      local_920 = (undefined8 *)(lVar35 + 0x1538);
      local_928 = (undefined8 *)(lVar35 + 0x14f8);
      local_758 = (undefined8 *)(lVar35 + 0x15c8);
      local_760 = (undefined8 *)(lVar35 + 0x1588);
      local_768 = (undefined8 *)(lVar35 + 0x1548);
      local_770 = (undefined8 *)(lVar35 + 0x1508);
      local_778 = (undefined8 *)(lVar35 + 0x15a8);
      local_780 = (undefined8 *)(lVar35 + 0x1568);
      local_788 = (undefined8 *)(lVar35 + 0x1528);
      p_Var32 = (_anonymous_namespace_ *)0x0;
      local_97c = iVar15;
      do {
        local_9e0 = pUVar24 + (long)p_Var32;
        local_9d8 = local_9e0->location;
        local_988 = p_Var32;
        glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsBasicType> *)local_570,&local_9e0->type);
        while( true ) {
          auStack_900._8_8_ = 0;
          auStack_900._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_908 = (undefined1  [4])0x0;
          fStack_904 = 0.0;
          auStack_900._0_4_ = TYPE_INVALID;
          auStack_900._4_4_ = PRECISION_LOWP;
          bVar13 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                             ((SubTypeIterator<glu::IsBasicType> *)local_570,
                              (SubTypeIterator<glu::IsBasicType> *)local_908);
          pvVar11 = (void *)CONCAT44(auStack_900._4_4_,auStack_900._0_4_);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11,auStack_900._16_8_ - (long)pvVar11);
          }
          iVar15 = local_97c;
          pUVar24 = local_9e0;
          if (!bVar13) break;
          glu::
          getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)local_a78,(glu *)local_9e0,(VarType *)local_568[0]._0_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )local_568[0].m_data._0_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )VVar40);
          Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                    ((string *)local_978,local_988,(int)pUVar24,local_568,
                     (TypeComponentVector *)VVar40);
          iVar15 = (**(code **)(lVar35 + 0xb48))(local_990 & 0xffffffff,local_978._0_8_);
          DVar14 = glu::getDataTypeScalarType(local_a78._8_4_);
          pcVar21 = glu::getDataTypeName(DVar14);
          fVar48 = getExpectedValue(DVar14,local_9d8,pcVar21);
          local_a10 = CONCAT44(local_a10._4_4_,fVar48);
          uVar44 = DVar14 - TYPE_SAMPLER_1D;
          if (uVar44 < 0x1e) {
            uVar36 = local_a58._M_string_length - (long)local_a58._M_dataplus._M_p;
            iVar34 = (*local_a38->m_renderCtx->_vptr_RenderContext[3])();
            lVar25 = CONCAT44(extraout_var_03,iVar34);
            uVar47 = 0;
            if (uVar44 < 0x1a) {
              uVar47 = *(uint *)(&DAT_01c629c0 + (ulong)uVar44 * 4);
            }
            this_00 = (Texture2D *)operator_new(0x70);
            VVar40.type = 0x10;
            VVar40.index = 0;
            glu::Texture2D::Texture2D(this_00,local_a38->m_renderCtx,uVar47,0x10,0x10);
            tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
            if (((uVar47 & 0xffff) == 0x8d8e) || ((uVar47 & 0xffff) == 0x8d7c)) {
              local_908 = (undefined1  [4])(int)(float)local_a10;
              fStack_904 = 0.0;
              auStack_900._0_4_ = TYPE_INVALID;
              auStack_900._4_4_ = PRECISION_LOWP;
              tcu::clear((this_00->m_refTexture).super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(IVec4 *)local_908);
            }
            else {
              local_908 = (undefined1  [4])(float)local_a10;
              fStack_904 = 0.0;
              auStack_900._0_4_ = TYPE_INVALID;
              auStack_900._4_4_ = 0x3f800000;
              tcu::clear((this_00->m_refTexture).super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_908);
            }
            uVar36 = uVar36 >> 3;
            (**(code **)(lVar25 + 8))((int)uVar36 + 0x84c0);
            (*this_00->_vptr_Texture2D[2])(this_00);
            (**(code **)(lVar25 + 0xb8))(0xde1,this_00->m_glTexture);
            (**(code **)(lVar25 + 0x1360))(0xde1,0x2800,0x2600);
            (**(code **)(lVar25 + 0x1360))(0xde1,0x2801,0x2600);
            dVar17 = (**(code **)(lVar25 + 0x800))();
            glu::checkError(dVar17,"UniformLocationCase: texture upload",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                            ,0x204);
            local_700 = this_00;
            std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
            emplace_back<glu::Texture2D*>
                      ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&local_a58,
                       &local_700);
            (**(code **)(lVar35 + 0x14f0))(iVar15,uVar36 & 0xffffffff);
            goto switchD_0152590b_caseD_e;
          }
          if (iVar15 < 0) goto switchD_0152590b_caseD_e;
          local_3f8._0_4_ = fVar48;
          local_948.m_type = (VarType *)CONCAT44(local_948.m_type._4_4_,(int)fVar48);
          local_9b8._0_4_ = (int)(long)fVar48;
          pTVar8 = ((local_a38->super_TestCase).super_TestNode.m_testCtx)->m_log;
          local_908 = SUB84(pTVar8,0);
          fStack_904 = (float)((ulong)pTVar8 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_900);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_900,"Set uniform ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_900,(char *)local_978._0_8_,
                     CONCAT44(local_978._12_4_,local_978._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_900," in location ",0xd);
          std::ostream::operator<<((ostringstream *)auStack_900,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_900," to ",4);
          std::ostream::_M_insert<double>((double)(float)local_a10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_908,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_900);
          std::ios_base::~ios_base(local_890);
          if (0x25 < local_a78._8_4_ - TYPE_FLOAT) goto switchD_0152590b_caseD_e;
          pSVar33 = (SubTypeIterator<glu::IsBasicType> *)local_3f8;
          puVar23 = local_710;
          VVar40 = local_708;
          switch(local_a78._8_4_) {
          case 1:
            break;
          case 2:
            puVar23 = local_788;
            break;
          case 3:
            puVar23 = local_780;
            break;
          case 4:
            puVar23 = local_778;
            break;
          case 5:
            goto switchD_0152590b_caseD_5;
          case 6:
            VVar40 = local_750;
            goto switchD_0152590b_caseD_5;
          case 7:
            VVar40 = local_748;
            goto switchD_0152590b_caseD_5;
          case 8:
            VVar40 = local_740;
            goto switchD_0152590b_caseD_5;
          case 9:
            VVar40 = local_738;
            goto switchD_0152590b_caseD_5;
          case 10:
            VVar40 = local_730;
            goto switchD_0152590b_caseD_5;
          case 0xb:
            VVar40 = local_728;
            goto switchD_0152590b_caseD_5;
          case 0xc:
            VVar40 = local_720;
            goto switchD_0152590b_caseD_5;
          case 0xd:
            VVar40 = local_718;
switchD_0152590b_caseD_5:
            (**(code **)VVar40)(iVar15,1,0,local_3f8);
          default:
            goto switchD_0152590b_caseD_e;
          case 0x1b:
          case 0x23:
            pSVar33 = &local_948;
            puVar23 = local_928;
            break;
          case 0x1c:
          case 0x24:
            pSVar33 = &local_948;
            puVar23 = local_920;
            break;
          case 0x1d:
          case 0x25:
            pSVar33 = &local_948;
            puVar23 = local_918;
            break;
          case 0x1e:
          case 0x26:
            pSVar33 = &local_948;
            puVar23 = local_910;
            break;
          case 0x1f:
            puVar23 = local_770;
            goto LAB_01525aea;
          case 0x20:
            puVar23 = local_768;
            goto LAB_01525aea;
          case 0x21:
            puVar23 = local_760;
            goto LAB_01525aea;
          case 0x22:
            puVar23 = local_758;
LAB_01525aea:
            pSVar33 = (SubTypeIterator<glu::IsBasicType> *)local_9b8;
          }
          (*(code *)*puVar23)(iVar15,1,pSVar33);
switchD_0152590b_caseD_e:
          if ((VarType *)local_978._0_8_ != &local_968) {
            operator_delete((void *)local_978._0_8_,(ulong)(local_968._0_8_ + 1));
          }
          glu::VarType::~VarType((VarType *)local_a78);
          glu::SubTypeIterator<glu::IsBasicType>::operator++
                    ((SubTypeIterator<glu::IsBasicType> *)&local_a08,
                     (SubTypeIterator<glu::IsBasicType> *)local_570,0);
          local_9d8 = local_9d8 - ((int)~local_9d8 >> 0x1f);
          if ((void *)local_a08._M_string_length != (void *)0x0) {
            operator_delete((void *)local_a08._M_string_length,
                            local_a08.field_2._8_8_ - local_a08._M_string_length);
          }
        }
        if ((VarType *)local_568[0]._0_8_ != (VarType *)0x0) {
          operator_delete((void *)local_568[0]._0_8_,local_568[0].m_data._8_8_ - local_568[0]._0_8_)
          ;
        }
        p_Var32 = (_anonymous_namespace_ *)(ulong)((int)local_988 + 1);
        pUVar24 = (local_9e8->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        p_Var29 = (_anonymous_namespace_ *)
                  (((long)(local_9e8->
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar24 >> 3) *
                  -0x3333333333333333);
      } while (p_Var32 <= p_Var29 && (long)p_Var29 - (long)p_Var32 != 0);
    }
    (**(code **)(lVar35 + 0x610))(iVar15);
    (**(code **)(lVar35 + 0x19f0))(iVar15,4,0x1406,0,0,local_6e8);
    (**(code **)(lVar35 + 0x568))(4,6,0x1403,&local_6f8);
    (**(code **)(lVar35 + 0x518))(iVar15);
    pUVar46 = local_a38;
    _Var39._M_p = local_a58._M_dataplus._M_p;
    if (0 < (int)(local_a58._M_string_length - (long)local_a58._M_dataplus._M_p >> 3)) {
      lVar35 = 0;
      sVar30 = local_a58._M_string_length;
      do {
        plVar19 = *(long **)((long)_Var39._M_p + lVar35 * 8);
        if (plVar19 != (long *)0x0) {
          (**(code **)(*plVar19 + 8))(plVar19);
          sVar30 = local_a58._M_string_length;
          _Var39._M_p = local_a58._M_dataplus._M_p;
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 < (int)(sVar30 - (long)_Var39._M_p >> 3));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var39._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(_Var39._M_p,local_a58.field_2._M_allocated_capacity - (long)_Var39._M_p);
    }
    context = pUVar46->m_renderCtx;
    iVar15 = (int)local_9c8;
    iVar34 = local_9c8._4_4_;
    local_6e8._0_4_ = RGBA;
    local_6e8._4_4_ = UNORM_INT8;
    pTVar43 = (TypeComponentVector *)local_a30._16_8_;
    if ((TypeComponentVector *)local_a30._16_8_ != (TypeComponentVector *)0x0) {
      pTVar43 = (TypeComponentVector *)local_a30._8_8_;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_908,(TextureFormat *)local_6e8,local_a30._0_4_,
               local_a30._4_4_,1,pTVar43);
    glu::readPixels(context,iVar15,iVar34,(PixelBufferAccess *)local_908);
    local_6e8._0_4_ = RGBA;
    local_6e8._4_4_ = UNORM_INT8;
    if ((TypeComponentVector *)local_a30._16_8_ != (TypeComponentVector *)0x0) {
      local_a30._16_8_ = local_a30._8_8_;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_908,(TextureFormat *)local_6e8,local_a30._0_4_,
               local_a30._4_4_,1,(void *)local_a30._16_8_);
    if (0 < (int)auStack_900._4_4_) {
      iVar15 = 0;
      PVar18 = auStack_900._4_4_;
      DVar14 = auStack_900._0_4_;
      do {
        if (0 < (int)DVar14) {
          iVar34 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_6e8,(int)local_908,iVar34,iVar15);
            auVar49._0_4_ = (float)local_6e8._0_4_ + -1.0;
            auVar49._4_4_ = (float)local_6e8._4_4_ + -1.0;
            auVar49._8_4_ = (float)auStack_6e0._0_4_ + -1.0;
            auVar49._12_4_ = (float)auStack_6e0._4_4_ + -1.0;
            uVar36 = CONCAT44(auVar49._4_4_,auVar49._0_4_);
            auVar50._0_8_ = uVar36 ^ 0x8000000080000000;
            auVar50._8_4_ = -auVar49._8_4_;
            auVar50._12_4_ = -auVar49._12_4_;
            auVar51 = maxps(auVar50,auVar49);
            auVar52._4_4_ = -(uint)(auVar51._4_4_ <= 0.1);
            auVar52._0_4_ = -(uint)(auVar51._0_4_ <= 0.1);
            auVar52._8_4_ = -(uint)(auVar51._8_4_ <= 0.1);
            auVar52._12_4_ = -(uint)(auVar51._12_4_ <= 0.1);
            auVar51 = packssdw(auVar52,auVar52);
            auVar51 = packsswb(auVar51,auVar51);
            local_6e8._0_4_ = SUB164(auVar51 & _DAT_01b805f0,0);
            if (SUB161(auVar51 & _DAT_01b805f0,0) == '\0') {
LAB_01525e94:
              pcVar21 = "Shader produced incorrect result";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_01525ea0;
            }
            uVar36 = 0xffffffffffffffff;
            do {
              if (uVar36 == 2) goto LAB_01525ddb;
              uVar2 = uVar36 + 1;
              lVar35 = uVar36 + 2;
              uVar36 = uVar2;
            } while (local_6e8[lVar35] != '\0');
            if (uVar2 < 3) goto LAB_01525e94;
LAB_01525ddb:
            iVar34 = iVar34 + 1;
            PVar18 = auStack_900._4_4_;
            DVar14 = auStack_900._0_4_;
          } while (iVar34 < (int)auStack_900._0_4_);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < (int)PVar18);
    }
    pcVar21 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
LAB_01525ea0:
    tcu::TestContext::setTestResult
              ((local_a38->super_TestCase).super_TestNode.m_testCtx,testResult,pcVar21);
  }
  tcu::Surface::~Surface((Surface *)local_a30);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar35 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar35));
    lVar35 = lVar35 + -0x18;
  } while (lVar35 != -0x18);
  return extraout_EAX;
}

Assistant:

UniformLocationCase::IterateResult UniformLocationCase::run (const vector<UniformInfo>& uniformList)
{
	using gls::TextureTestUtil::RandomViewport;

	const glu::ProgramSources	sources		= genShaderSources(uniformList);
	const glu::ShaderProgram	program		(m_renderCtx, sources);
	const int					baseSeed	= m_testCtx.getCommandLine().getBaseSeed();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	const RandomViewport		viewport	(m_renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()) + baseSeed);

	tcu::Surface				rendered	(RENDER_SIZE, RENDER_SIZE);

	if (!verifyLocations(program, uniformList))
		return STOP;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	render(program, uniformList);

	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	if (!verifyResult(rendered.getAccess()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader produced incorrect result");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}